

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugFrame.cpp
# Opt level: O0

void __thiscall
llvm::dwarf::CFIProgram::printOperand
          (CFIProgram *this,raw_ostream *OS,MCRegisterInfo *MRI,bool IsEH,Instruction *Instr,
          uint OperandIdx,uint64_t Operand)

{
  MCRegisterInfo *pMVar1;
  bool bVar2;
  OperandType (*paOVar3) [2];
  raw_ostream *prVar4;
  DWARFExpression *this_00;
  char *Str;
  format_object<unsigned_long> local_188;
  format_object<unsigned_long> local_170;
  unsigned_long local_158;
  format_object<unsigned_long> local_150;
  uint64_t local_138;
  format_object<long> local_130;
  long local_118;
  format_object<long> local_110;
  format_object<unsigned_long> local_f8;
  unsigned_long local_e0;
  format_object<unsigned_long> local_d8;
  uint64_t local_c0;
  format_object<long> local_b8;
  format_object<unsigned_long> local_a0;
  format_object<unsigned_char> local_88;
  char *local_70;
  char *local_68;
  undefined1 local_60 [8];
  StringRef OpcodeName;
  byte local_35;
  OperandType Type;
  uint8_t Opcode;
  Instruction *pIStack_30;
  uint OperandIdx_local;
  Instruction *Instr_local;
  MCRegisterInfo *pMStack_20;
  bool IsEH_local;
  MCRegisterInfo *MRI_local;
  raw_ostream *OS_local;
  CFIProgram *this_local;
  
  Type = OperandIdx;
  pIStack_30 = Instr;
  Instr_local._7_1_ = IsEH;
  pMStack_20 = MRI;
  MRI_local = (MCRegisterInfo *)OS;
  OS_local = (raw_ostream *)this;
  if (1 < OperandIdx) {
    __assert_fail("OperandIdx < 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFDebugFrame.cpp"
                  ,0xdc,
                  "void llvm::dwarf::CFIProgram::printOperand(raw_ostream &, const MCRegisterInfo *, bool, const Instruction &, unsigned int, uint64_t) const"
                 );
  }
  local_35 = Instr->Opcode;
  join_0x00000010_0x00000000_ = getOperandTypes();
  paOVar3 = ArrayRef<llvm::dwarf::CFIProgram::OperandType[2]>::operator[]
                      ((ArrayRef<llvm::dwarf::CFIProgram::OperandType[2]> *)&OpcodeName.Length,
                       (ulong)local_35);
  pMVar1 = MRI_local;
  switch((*paOVar3)[Type]) {
  case OT_Unset:
    prVar4 = raw_ostream::operator<<((raw_ostream *)MRI_local," Unsupported ");
    Str = "first";
    if (Type != OT_Unset) {
      Str = "second";
    }
    prVar4 = raw_ostream::operator<<(prVar4,Str);
    raw_ostream::operator<<(prVar4," operand to");
    _local_60 = CallFrameString((uint)local_35,this->Arch);
    bVar2 = StringRef::empty((StringRef *)local_60);
    pMVar1 = MRI_local;
    if (bVar2) {
      format<unsigned_char>(&local_88," Opcode %x",&local_35);
      raw_ostream::operator<<((raw_ostream *)pMVar1,&local_88.super_format_object_base);
    }
    else {
      prVar4 = raw_ostream::operator<<((raw_ostream *)MRI_local," ");
      local_70 = (char *)local_60;
      local_68 = OpcodeName.Data;
      raw_ostream::operator<<(prVar4,_local_60);
    }
    break;
  case OT_None:
    break;
  case OT_Address:
    format<unsigned_long>(&local_a0," %lx",&Operand);
    raw_ostream::operator<<((raw_ostream *)pMVar1,&local_a0.super_format_object_base);
    break;
  case OT_Offset:
    local_c0 = Operand;
    format<long>(&local_b8," %+ld",(long *)&local_c0);
    raw_ostream::operator<<((raw_ostream *)pMVar1,&local_b8.super_format_object_base);
    break;
  case OT_FactoredCodeOffset:
    if (this->CodeAlignmentFactor == 0) {
      format<unsigned_long>(&local_f8," %ld*code_alignment_factor",&Operand);
      raw_ostream::operator<<((raw_ostream *)pMVar1,&local_f8.super_format_object_base);
    }
    else {
      local_e0 = Operand * this->CodeAlignmentFactor;
      format<unsigned_long>(&local_d8," %ld",&local_e0);
      raw_ostream::operator<<((raw_ostream *)pMVar1,&local_d8.super_format_object_base);
    }
    break;
  case OT_SignedFactDataOffset:
    if (this->DataAlignmentFactor == 0) {
      local_138 = Operand;
      format<long>(&local_130," %ld*data_alignment_factor",(long *)&local_138);
      raw_ostream::operator<<((raw_ostream *)pMVar1,&local_130.super_format_object_base);
    }
    else {
      local_118 = Operand * this->DataAlignmentFactor;
      format<long>(&local_110," %ld",&local_118);
      raw_ostream::operator<<((raw_ostream *)pMVar1,&local_110.super_format_object_base);
    }
    break;
  case OT_UnsignedFactDataOffset:
    if (this->DataAlignmentFactor == 0) {
      format<unsigned_long>(&local_170," %ld*data_alignment_factor",&Operand);
      raw_ostream::operator<<((raw_ostream *)pMVar1,&local_170.super_format_object_base);
    }
    else {
      local_158 = Operand * this->DataAlignmentFactor;
      format<unsigned_long>(&local_150," %ld",&local_158);
      raw_ostream::operator<<((raw_ostream *)pMVar1,&local_150.super_format_object_base);
    }
    break;
  case OT_Register:
    format<unsigned_long>(&local_188," reg%ld",&Operand);
    raw_ostream::operator<<((raw_ostream *)pMVar1,&local_188.super_format_object_base);
    break;
  case OT_Expression:
    bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&pIStack_30->Expression);
    if (!bVar2) {
      __assert_fail("Instr.Expression && \"missing DWARFExpression object\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFDebugFrame.cpp"
                    ,0x10b,
                    "void llvm::dwarf::CFIProgram::printOperand(raw_ostream &, const MCRegisterInfo *, bool, const Instruction &, unsigned int, uint64_t) const"
                   );
    }
    raw_ostream::operator<<((raw_ostream *)MRI_local," ");
    this_00 = Optional<llvm::DWARFExpression>::operator->(&pIStack_30->Expression);
    DWARFExpression::print
              (this_00,(raw_ostream *)MRI_local,pMStack_20,(DWARFUnit *)0x0,
               (bool)(Instr_local._7_1_ & 1));
  }
  return;
}

Assistant:

void CFIProgram::printOperand(raw_ostream &OS, const MCRegisterInfo *MRI,
                              bool IsEH, const Instruction &Instr,
                              unsigned OperandIdx, uint64_t Operand) const {
  assert(OperandIdx < 2);
  uint8_t Opcode = Instr.Opcode;
  OperandType Type = getOperandTypes()[Opcode][OperandIdx];

  switch (Type) {
  case OT_Unset: {
    OS << " Unsupported " << (OperandIdx ? "second" : "first") << " operand to";
    auto OpcodeName = CallFrameString(Opcode, Arch);
    if (!OpcodeName.empty())
      OS << " " << OpcodeName;
    else
      OS << format(" Opcode %x",  Opcode);
    break;
  }
  case OT_None:
    break;
  case OT_Address:
    OS << format(" %" PRIx64, Operand);
    break;
  case OT_Offset:
    // The offsets are all encoded in a unsigned form, but in practice
    // consumers use them signed. It's most certainly legacy due to
    // the lack of signed variants in the first Dwarf standards.
    OS << format(" %+" PRId64, int64_t(Operand));
    break;
  case OT_FactoredCodeOffset: // Always Unsigned
    if (CodeAlignmentFactor)
      OS << format(" %" PRId64, Operand * CodeAlignmentFactor);
    else
      OS << format(" %" PRId64 "*code_alignment_factor" , Operand);
    break;
  case OT_SignedFactDataOffset:
    if (DataAlignmentFactor)
      OS << format(" %" PRId64, int64_t(Operand) * DataAlignmentFactor);
    else
      OS << format(" %" PRId64 "*data_alignment_factor" , int64_t(Operand));
    break;
  case OT_UnsignedFactDataOffset:
    if (DataAlignmentFactor)
      OS << format(" %" PRId64, Operand * DataAlignmentFactor);
    else
      OS << format(" %" PRId64 "*data_alignment_factor" , Operand);
    break;
  case OT_Register:
    OS << format(" reg%" PRId64, Operand);
    break;
  case OT_Expression:
    assert(Instr.Expression && "missing DWARFExpression object");
    OS << " ";
    Instr.Expression->print(OS, MRI, nullptr, IsEH);
    break;
  }
}